

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.cpp
# Opt level: O2

string * __thiscall
helics::generateInterfaceQueryResults
          (string *__return_storage_ptr__,helics *this,string_view request,InterfaceInfo *info,
          function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
          *addHeaderInfo)

{
  value_t vVar1;
  long *plVar2;
  json_value jVar3;
  long lVar4;
  bool bVar5;
  reference pvVar6;
  ulong uVar7;
  InterfaceInfo *this_00;
  char *pcVar8;
  long *plVar9;
  data *this_01;
  unique_ptr<helics::PublicationInfo,_std::default_delete<helics::PublicationInfo>_> *ele;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *handle;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  initializer_list_t init;
  initializer_list_t init_00;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  initializer_list_t init_01;
  initializer_list_t init_02;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  initializer_list_t init_03;
  initializer_list_t init_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  shared_handle local_e8;
  data local_d0;
  json base_2;
  json base_3;
  json base;
  json ipt;
  data local_60;
  data local_50;
  data local_40;
  
  this_00 = (InterfaceInfo *)request._M_str;
  pcVar8 = (char *)request._M_len;
  __y._M_str = "publications";
  __y._M_len = 0xc;
  __x._M_str = pcVar8;
  __x._M_len = (size_t)this;
  bVar5 = std::operator==(__x,__y);
  if (bVar5) {
    gmlc::libguarded::
    shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::lock_shared((shared_handle *)&local_e8,&this_00->publications);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base_3);
    plVar2 = (long *)((undefined8 *)CONCAT71(local_e8.data._1_7_,(value_t)local_e8.data))[1];
    for (plVar9 = *(long **)CONCAT71(local_e8.data._1_7_,(value_t)local_e8.data); plVar9 != plVar2;
        plVar9 = plVar9 + 1) {
      if (*(long *)(*plVar9 + 0x28) != 0) {
        std::__cxx11::string::string
                  ((string *)&ipt,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (*plVar9 + 0x20));
        generateJsonQuotedString((string *)&base_3,(string *)&ipt);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base_3);
        std::__cxx11::string::~string((string *)&base_3);
        std::__cxx11::string::~string((string *)&ipt);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,',');
      }
    }
    uVar7 = __return_storage_ptr__->_M_string_length;
    if (uVar7 < 2) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,']');
      goto LAB_002f674d;
    }
  }
  else {
    __y_00._M_str = "inputs";
    __y_00._M_len = 6;
    __x_00._M_str = pcVar8;
    __x_00._M_len = (size_t)this;
    bVar5 = std::operator==(__x_00,__y_00);
    if (bVar5) {
      gmlc::libguarded::
      shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
      ::lock_shared((shared_handle *)&local_e8,&this_00->inputs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base_3);
      plVar2 = (long *)((undefined8 *)CONCAT71(local_e8.data._1_7_,(value_t)local_e8.data))[1];
      for (plVar9 = *(long **)CONCAT71(local_e8.data._1_7_,(value_t)local_e8.data); plVar9 != plVar2
          ; plVar9 = plVar9 + 1) {
        if (*(long *)(*plVar9 + 0x10) != 0) {
          std::__cxx11::string::string
                    ((string *)&ipt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*plVar9 + 8));
          generateJsonQuotedString((string *)&base_3,(string *)&ipt);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base_3);
          std::__cxx11::string::~string((string *)&base_3);
          std::__cxx11::string::~string((string *)&ipt);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,',');
        }
      }
      uVar7 = __return_storage_ptr__->_M_string_length;
      if (uVar7 < 2) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,']');
        goto LAB_002f674d;
      }
    }
    else {
      __y_01._M_str = "endpoints";
      __y_01._M_len = 9;
      __x_01._M_str = pcVar8;
      __x_01._M_len = (size_t)this;
      bVar5 = std::operator==(__x_01,__y_01);
      if (!bVar5) {
        __y_02._M_str = "input_details";
        __y_02._M_len = 0xd;
        __x_02._M_str = pcVar8;
        __x_02._M_len = (size_t)this;
        bVar5 = std::operator==(__x_02,__y_02);
        if (bVar5) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json(&base,(nullptr_t)0x0);
          std::
          function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
          ::operator()((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                        *)info,&base);
          init._M_len = 0;
          init._M_array = (iterator)&local_40;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::array(init);
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)&base,"inputs");
          vVar1 = (pvVar6->m_data).m_type;
          (pvVar6->m_data).m_type = local_40.m_type;
          jVar3 = (pvVar6->m_data).m_value;
          (pvVar6->m_data).m_value = local_40.m_value;
          local_40.m_type = vVar1;
          local_40.m_value = jVar3;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_40);
          gmlc::libguarded::
          shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          ::lock_shared((shared_handle *)&base_3,&this_00->inputs);
          plVar2 = *(long **)(base_3.m_data._0_8_ + 8);
          for (plVar9 = *(long **)base_3.m_data._0_8_; plVar9 != plVar2; plVar9 = plVar9 + 1) {
            lVar4 = *plVar9;
            if (*(long *)(lVar4 + 0x10) != 0) {
              init_00._M_len = 0;
              init_00._M_array = (iterator)&ipt.m_data;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::object(init_00);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar4 + 8));
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)&ipt.m_data,"name");
              vVar1 = (pvVar6->m_data).m_type;
              (pvVar6->m_data).m_type = (value_t)local_e8.data;
              jVar3 = (pvVar6->m_data).m_value;
              (pvVar6->m_data).m_value = (json_value)local_e8.m_handle_lock._M_pm;
              local_e8.data._0_1_ = vVar1;
              local_e8.m_handle_lock._M_pm = (mutex_type *)jVar3;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data((data *)&local_e8);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar4 + 0x48));
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)&ipt.m_data,"units");
              vVar1 = (pvVar6->m_data).m_type;
              (pvVar6->m_data).m_type = local_d0.m_type;
              jVar3 = (pvVar6->m_data).m_value;
              (pvVar6->m_data).m_value = local_d0.m_value;
              local_d0.m_type = vVar1;
              local_d0.m_value = jVar3;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_d0);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&base_2.m_data,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar4 + 0x28));
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)&ipt.m_data,"type");
              vVar1 = (pvVar6->m_data).m_type;
              (pvVar6->m_data).m_type = base_2.m_data.m_type;
              jVar3 = (pvVar6->m_data).m_value;
              (pvVar6->m_data).m_value = base_2.m_data.m_value;
              base_2.m_data.m_type = vVar1;
              base_2.m_data.m_value = jVar3;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&base_2.m_data);
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)&base,"inputs");
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back(pvVar6,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)&ipt.m_data);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&ipt.m_data);
            }
          }
          std::shared_lock<std::shared_mutex>::~shared_lock
                    ((shared_lock<std::shared_mutex> *)&base_3.m_data.m_value);
          fileops::generateJsonString(__return_storage_ptr__,&base,true);
        }
        else {
          __y_03._M_str = "publication_details";
          __y_03._M_len = 0x13;
          __x_03._M_str = pcVar8;
          __x_03._M_len = (size_t)this;
          bVar5 = std::operator==(__x_03,__y_03);
          if (!bVar5) {
            __y_04._M_str = "endpoint_details";
            __y_04._M_len = 0x10;
            __x_04._M_str = pcVar8;
            __x_04._M_len = (size_t)this;
            bVar5 = std::operator==(__x_04,__y_04);
            if (bVar5) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json(&base_2,(nullptr_t)0x0);
              std::
              function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              ::operator()((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                            *)info,&base_2);
              init_03._M_len = 0;
              init_03._M_array = (iterator)&local_60;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::array(init_03);
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)&base_2,"endpoints");
              vVar1 = (pvVar6->m_data).m_type;
              (pvVar6->m_data).m_type = local_60.m_type;
              jVar3 = (pvVar6->m_data).m_value;
              (pvVar6->m_data).m_value = local_60.m_value;
              local_60.m_type = vVar1;
              local_60.m_value = jVar3;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_60);
              gmlc::libguarded::
              shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
              ::lock_shared((shared_handle *)&base_3,&this_00->endpoints);
              plVar2 = *(long **)(base_3.m_data._0_8_ + 8);
              for (plVar9 = *(long **)base_3.m_data._0_8_; plVar9 != plVar2; plVar9 = plVar9 + 1) {
                lVar4 = *plVar9;
                if (*(long *)(lVar4 + 0x10) != 0) {
                  init_04._M_len = 0;
                  init_04._M_array = (iterator)&ipt.m_data;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::object(init_04);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (lVar4 + 8));
                  pvVar6 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                       *)&ipt.m_data,"name");
                  vVar1 = (pvVar6->m_data).m_type;
                  (pvVar6->m_data).m_type = (value_t)local_e8.data;
                  jVar3 = (pvVar6->m_data).m_value;
                  (pvVar6->m_data).m_value = (json_value)local_e8.m_handle_lock._M_pm;
                  local_e8.data._0_1_ = vVar1;
                  local_e8.m_handle_lock._M_pm = (mutex_type *)jVar3;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data((data *)&local_e8);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_d0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (lVar4 + 0x28));
                  pvVar6 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                       *)&ipt.m_data,"type");
                  vVar1 = (pvVar6->m_data).m_type;
                  (pvVar6->m_data).m_type = local_d0.m_type;
                  jVar3 = (pvVar6->m_data).m_value;
                  (pvVar6->m_data).m_value = local_d0.m_value;
                  local_d0.m_type = vVar1;
                  local_d0.m_value = jVar3;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&local_d0);
                  pvVar6 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>
                                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                       *)&base_2,"endpoints");
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::push_back(pvVar6,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)&ipt.m_data);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&ipt.m_data);
                }
              }
              std::shared_lock<std::shared_mutex>::~shared_lock
                        ((shared_lock<std::shared_mutex> *)&base_3.m_data.m_value);
              fileops::generateJsonString(__return_storage_ptr__,&base_2,true);
              this_01 = &base_2.m_data;
            }
            else {
              __y_05._M_str = "interface_details";
              __y_05._M_len = 0x11;
              __x_05._M_str = pcVar8;
              __x_05._M_len = (size_t)this;
              bVar5 = std::operator==(__x_05,__y_05);
              if (!bVar5) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                __return_storage_ptr__->_M_string_length = 0;
                (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                return __return_storage_ptr__;
              }
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json(&base_3,(nullptr_t)0x0);
              std::
              function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              ::operator()((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                            *)info,&base_3);
              InterfaceInfo::generateInferfaceConfig(this_00,&base_3);
              fileops::generateJsonString(__return_storage_ptr__,&base_3,true);
              this_01 = &base_3.m_data;
            }
            goto LAB_002f6af5;
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json(&base,(nullptr_t)0x0);
          std::
          function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
          ::operator()((function<void_(nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
                        *)info,&base);
          init_01._M_len = 0;
          init_01._M_array = (iterator)&local_50;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::array(init_01);
          pvVar6 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)&base,"publications");
          vVar1 = (pvVar6->m_data).m_type;
          (pvVar6->m_data).m_type = local_50.m_type;
          jVar3 = (pvVar6->m_data).m_value;
          (pvVar6->m_data).m_value = local_50.m_value;
          local_50.m_type = vVar1;
          local_50.m_value = jVar3;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_50);
          gmlc::libguarded::
          shared_guarded<gmlc::containers::DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
          ::lock_shared((shared_handle *)&base_3,&this_00->publications);
          plVar2 = *(long **)(base_3.m_data._0_8_ + 8);
          for (plVar9 = *(long **)base_3.m_data._0_8_; plVar9 != plVar2; plVar9 = plVar9 + 1) {
            lVar4 = *plVar9;
            if (*(long *)(lVar4 + 0x28) != 0) {
              init_02._M_len = 0;
              init_02._M_array = (iterator)&ipt.m_data;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::object(init_02);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar4 + 0x20));
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)&ipt.m_data,"name");
              vVar1 = (pvVar6->m_data).m_type;
              (pvVar6->m_data).m_type = (value_t)local_e8.data;
              jVar3 = (pvVar6->m_data).m_value;
              (pvVar6->m_data).m_value = (json_value)local_e8.m_handle_lock._M_pm;
              local_e8.data._0_1_ = vVar1;
              local_e8.m_handle_lock._M_pm = (mutex_type *)jVar3;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data((data *)&local_e8);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar4 + 0x60));
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)&ipt.m_data,"units");
              vVar1 = (pvVar6->m_data).m_type;
              (pvVar6->m_data).m_type = local_d0.m_type;
              jVar3 = (pvVar6->m_data).m_value;
              (pvVar6->m_data).m_value = local_d0.m_value;
              local_d0.m_type = vVar1;
              local_d0.m_value = jVar3;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_d0);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&base_2.m_data,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar4 + 0x40));
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)&ipt.m_data,"type");
              vVar1 = (pvVar6->m_data).m_type;
              (pvVar6->m_data).m_type = base_2.m_data.m_type;
              jVar3 = (pvVar6->m_data).m_value;
              (pvVar6->m_data).m_value = base_2.m_data.m_value;
              base_2.m_data.m_type = vVar1;
              base_2.m_data.m_value = jVar3;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&base_2.m_data);
              pvVar6 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)&base,"publications");
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back(pvVar6,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)&ipt.m_data);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&ipt.m_data);
            }
          }
          std::shared_lock<std::shared_mutex>::~shared_lock
                    ((shared_lock<std::shared_mutex> *)&base_3.m_data.m_value);
          fileops::generateJsonString(__return_storage_ptr__,&base,true);
        }
        this_01 = &base.m_data;
LAB_002f6af5:
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(this_01);
        return __return_storage_ptr__;
      }
      gmlc::libguarded::
      shared_guarded<gmlc::containers::DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
      ::lock_shared(&local_e8,&this_00->endpoints);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"[",(allocator<char> *)&base_3);
      plVar2 = (long *)((undefined8 *)CONCAT71(local_e8.data._1_7_,(value_t)local_e8.data))[1];
      for (plVar9 = *(long **)CONCAT71(local_e8.data._1_7_,(value_t)local_e8.data); plVar9 != plVar2
          ; plVar9 = plVar9 + 1) {
        if (*(long *)(*plVar9 + 0x10) != 0) {
          std::__cxx11::string::string
                    ((string *)&ipt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*plVar9 + 8));
          generateJsonQuotedString((string *)&base_3,(string *)&ipt);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&base_3);
          std::__cxx11::string::~string((string *)&base_3);
          std::__cxx11::string::~string((string *)&ipt);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__,',');
        }
      }
      uVar7 = __return_storage_ptr__->_M_string_length;
      if (uVar7 < 2) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,']');
        goto LAB_002f674d;
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p[uVar7 - 1] = ']';
LAB_002f674d:
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_e8.m_handle_lock);
  return __return_storage_ptr__;
}

Assistant:

std::string generateInterfaceQueryResults(std::string_view request,
                                          const InterfaceInfo& info,
                                          const std::function<void(nlohmann::json&)>& addHeaderInfo)
{
    if (request == "publications") {
        return generateStringVector_if(
            info.getPublications(),
            [](auto& pub) { return pub->key; },
            [](auto& pub) { return !pub->key.empty(); });
    }
    if (request == "inputs") {
        return generateStringVector_if(
            info.getInputs(),
            [](auto& inp) { return inp->key; },
            [](auto& inp) { return !inp->key.empty(); });
    }

    if (request == "endpoints") {
        return generateStringVector_if(
            info.getEndpoints(),
            [](auto& ept) { return ept->key; },
            [](auto& ept) { return !ept->key.empty(); });
    }

    if (request == "input_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["inputs"] = nlohmann::json::array();
        for (const auto& handle : info.getInputs()) {
            if (!handle->key.empty()) {
                storeInput(*handle, base);
            }
        }
        return fileops::generateJsonString(base);
    }

    if (request == "publication_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["publications"] = nlohmann::json::array();
        for (const auto& handle : info.getPublications()) {
            if (!handle->key.empty()) {
                storePublication(*handle, base);
            }
        }
        return fileops::generateJsonString(base);
    }

    if (request == "endpoint_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        base["endpoints"] = nlohmann::json::array();
        for (const auto& handle : info.getEndpoints()) {
            if (!handle->key.empty()) {
                storeEndpoint(*handle, base);
            }
        }
        return fileops::generateJsonString(base);
    }
    if (request == "interface_details") {
        nlohmann::json base;
        addHeaderInfo(base);
        info.generateInferfaceConfig(base);
        return fileops::generateJsonString(base);
    }

    return std::string{};
}